

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.h
# Opt level: O0

bool __thiscall QItemSelectionRange::contains(QItemSelectionRange *this,QModelIndex *index)

{
  bool bVar1;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  QModelIndex *this_00;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::row(in_RSI);
  QModelIndex::column(in_RSI);
  this_00 = &local_20;
  QModelIndex::parent(this_00);
  bVar1 = contains((QItemSelectionRange *)in_RSI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                   ,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(const QModelIndex &index) const
    {
        return contains(index.row(), index.column(), index.parent());
    }